

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::crc_internal::CRC32::Extend(CRC32 *this,uint32_t *crc,void *bytes,size_t length)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  anon_class_8_1_8991fb9c local_c0;
  anon_class_8_1_8991fb9c combine_one_word;
  undefined1 auStack_b0 [4];
  uint32_t tmp;
  anon_class_48_6_9aa8aeb9 step_stride;
  anon_class_8_1_8991fb9c step_swath;
  uint32_t buf3;
  uint32_t buf2;
  uint32_t buf1;
  uint32_t buf0;
  size_t kSwathSize;
  anon_class_24_3_01789a0f step_one_byte;
  uint32_t l;
  uint8_t *e;
  uint8_t *p;
  size_t length_local;
  void *bytes_local;
  uint32_t *crc_local;
  CRC32 *this_local;
  
  puVar2 = (uint8_t *)((long)bytes + length);
  step_one_byte.l._4_4_ = *crc;
  step_one_byte.this = (CRC32 *)&e;
  step_one_byte.p = (uint8_t **)((long)&step_one_byte.l + 4);
  _buf1 = 0x10;
  kSwathSize = (size_t)this;
  e = (uint8_t *)bytes;
  p = (uint8_t *)length;
  length_local = (size_t)bytes;
  bytes_local = crc;
  crc_local = (uint32_t *)this;
  if (0xf < (ulong)((long)puVar2 - (long)bytes)) {
    uVar1 = little_endian::Load32(bytes);
    buf2 = uVar1 ^ step_one_byte.l._4_4_;
    buf3 = little_endian::Load32(e + 4);
    step_swath.this._4_4_ = little_endian::Load32(e + 8);
    step_swath.this._0_4_ = little_endian::Load32(e + 0xc);
    e = e + 0x10;
    _auStack_b0 = &buf2;
    step_stride.buf0 = (uint32_t *)&step_stride.buf3;
    step_stride.step_swath = (anon_class_8_1_8991fb9c *)&e;
    step_stride.p = (uint8_t **)&buf3;
    step_stride.buf1 = (uint32_t *)((long)&step_swath.this + 4);
    step_stride.buf2 = (uint32_t *)&step_swath;
    step_stride.buf3 = (uint32_t *)this;
    while (0x100 < (long)puVar2 - (long)e) {
      this_local = (CRC32 *)(e + 0x100);
      Extend::anon_class_48_6_9aa8aeb9::operator()((anon_class_48_6_9aa8aeb9 *)auStack_b0);
      Extend::anon_class_48_6_9aa8aeb9::operator()((anon_class_48_6_9aa8aeb9 *)auStack_b0);
      Extend::anon_class_48_6_9aa8aeb9::operator()((anon_class_48_6_9aa8aeb9 *)auStack_b0);
      Extend::anon_class_48_6_9aa8aeb9::operator()((anon_class_48_6_9aa8aeb9 *)auStack_b0);
    }
    while (0xf < (ulong)((long)puVar2 - (long)e)) {
      Extend::anon_class_48_6_9aa8aeb9::operator()((anon_class_48_6_9aa8aeb9 *)auStack_b0);
    }
    for (; 3 < (ulong)((long)puVar2 - (long)e); e = e + 4) {
      combine_one_word.this._4_4_ =
           Extend::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&step_stride.buf3,buf2,e);
      buf2 = buf3;
      buf3 = step_swath.this._4_4_;
      step_swath.this._4_4_ = (uint32_t)step_swath.this;
      step_swath.this._0_4_ = combine_one_word.this._4_4_;
    }
    local_c0.this = this;
    step_one_byte.l._4_4_ = Extend::anon_class_8_1_8991fb9c::operator()(&local_c0,0,buf2);
    step_one_byte.l._4_4_ =
         Extend::anon_class_8_1_8991fb9c::operator()(&local_c0,step_one_byte.l._4_4_,buf3);
    step_one_byte.l._4_4_ =
         Extend::anon_class_8_1_8991fb9c::operator()
                   (&local_c0,step_one_byte.l._4_4_,step_swath.this._4_4_);
    step_one_byte.l._4_4_ =
         Extend::anon_class_8_1_8991fb9c::operator()
                   (&local_c0,step_one_byte.l._4_4_,(uint32_t)step_swath.this);
  }
  while (e != puVar2) {
    Extend::anon_class_24_3_01789a0f::operator()((anon_class_24_3_01789a0f *)&kSwathSize);
  }
  *(uint32_t *)bytes_local = step_one_byte.l._4_4_;
  return;
}

Assistant:

void CRC32::Extend(uint32_t* crc, const void* bytes, size_t length) const {
  const uint8_t* p = static_cast<const uint8_t*>(bytes);
  const uint8_t* e = p + length;
  uint32_t l = *crc;

  auto step_one_byte = [this, &p, &l]() {
    int c = (l & 0xff) ^ *p++;
    l = this->table0_[c] ^ (l >> 8);
  };

  if (kNeedAlignedLoads) {
    // point x at first 4-byte aligned byte in string. this might be past the
    // end of the string.
    const uint8_t* x = RoundUp<4>(p);
    if (x <= e) {
      // Process bytes until finished or p is 4-byte aligned
      while (p != x) {
        step_one_byte();
      }
    }
  }

  const size_t kSwathSize = 16;
  if (static_cast<size_t>(e - p) >= kSwathSize) {
    // Load one swath of data into the operating buffers.
    uint32_t buf0 = absl::little_endian::Load32(p) ^ l;
    uint32_t buf1 = absl::little_endian::Load32(p + 4);
    uint32_t buf2 = absl::little_endian::Load32(p + 8);
    uint32_t buf3 = absl::little_endian::Load32(p + 12);
    p += kSwathSize;

    // Increment a CRC value by a "swath"; this combines the four bytes
    // starting at `ptr` and twelve zero bytes, so that four CRCs can be
    // built incrementally and combined at the end.
    const auto step_swath = [this](uint32_t crc_in, const std::uint8_t* ptr) {
      return absl::little_endian::Load32(ptr) ^
             this->table_[3][crc_in & 0xff] ^
             this->table_[2][(crc_in >> 8) & 0xff] ^
             this->table_[1][(crc_in >> 16) & 0xff] ^
             this->table_[0][crc_in >> 24];
    };

    // Run one CRC calculation step over all swaths in one 16-byte stride
    const auto step_stride = [&]() {
      buf0 = step_swath(buf0, p);
      buf1 = step_swath(buf1, p + 4);
      buf2 = step_swath(buf2, p + 8);
      buf3 = step_swath(buf3, p + 12);
      p += 16;
    };

    // Process kStride interleaved swaths through the data in parallel.
    while ((e - p) > kPrefetchHorizon) {
      PrefetchToLocalCacheNta(
          reinterpret_cast<const void*>(p + kPrefetchHorizon));
      // Process 64 bytes at a time
      step_stride();
      step_stride();
      step_stride();
      step_stride();
    }
    while (static_cast<size_t>(e - p) >= kSwathSize) {
      step_stride();
    }

    // Now advance one word at a time as far as possible. This isn't worth
    // doing if we have word-advance tables.
    while (static_cast<size_t>(e - p) >= 4) {
      buf0 = step_swath(buf0, p);
      uint32_t tmp = buf0;
      buf0 = buf1;
      buf1 = buf2;
      buf2 = buf3;
      buf3 = tmp;
      p += 4;
    }

    // Combine the results from the different swaths. This is just a CRC
    // on the data values in the bufX words.
    auto combine_one_word = [this](uint32_t crc_in, uint32_t w) {
      w ^= crc_in;
      for (size_t i = 0; i < 4; ++i) {
        w = (w >> 8) ^ this->table0_[w & 0xff];
      }
      return w;
    };

    l = combine_one_word(0, buf0);
    l = combine_one_word(l, buf1);
    l = combine_one_word(l, buf2);
    l = combine_one_word(l, buf3);
  }

  // Process the last few bytes
  while (p != e) {
    step_one_byte();
  }

  *crc = l;
}